

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

Node * __thiscall
TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>::NewKey
          (TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_> *this,AActor *key)

{
  Node *pNVar1;
  AActor *pAVar2;
  undefined7 uVar3;
  Node *pNVar4;
  uint uVar5;
  Node *pNVar6;
  Node *pNVar7;
  
  while (uVar5 = this->Size - 1 & (uint)key, pNVar1 = this->Nodes + uVar5,
        this->Nodes[uVar5].Next != (Node *)0x1) {
    pNVar4 = GetFreePos(this);
    if (pNVar4 != (Node *)0x0) {
      pNVar7 = this->Nodes + (this->Size - 1 & *(uint *)&(pNVar1->Pair).Key);
      if (this->Nodes + (this->Size - 1 & *(uint *)&(pNVar1->Pair).Key) != pNVar1)
      goto LAB_0042058e;
      pNVar4->Next = pNVar1->Next;
      pNVar7 = pNVar4;
      goto LAB_004205b0;
    }
    Rehash(this);
  }
LAB_004205ab:
  pNVar4 = (Node *)0x0;
  pNVar7 = pNVar1;
LAB_004205b0:
  pNVar1->Next = pNVar4;
  this->NumUsed = this->NumUsed + 1;
  (pNVar7->Pair).Key = key;
  return pNVar7;
LAB_0042058e:
  do {
    pNVar6 = pNVar7;
    pNVar7 = pNVar6->Next;
  } while (pNVar7 != pNVar1);
  pNVar6->Next = pNVar4;
  uVar3 = *(undefined7 *)&(pNVar1->Pair).field_0x9;
  (pNVar4->Pair).Value = (pNVar1->Pair).Value;
  *(undefined7 *)&(pNVar4->Pair).field_0x9 = uVar3;
  pAVar2 = (pNVar1->Pair).Key;
  pNVar4->Next = pNVar1->Next;
  (pNVar4->Pair).Key = pAVar2;
  goto LAB_004205ab;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}